

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_hook.cc
# Opt level: O0

bool __thiscall
base::internal::HookList<void_(*)(const_void_*,_unsigned_long)>::Remove
          (HookList<void_(*)(const_void_*,_unsigned_long)> *this,
          _func_void_void_ptr_unsigned_long *value)

{
  ulong uVar1;
  SpinLockHolder SVar2;
  atomic<void_(*)(const_void_*,_unsigned_long)> *paVar3;
  SpinLock *pSVar4;
  bool bVar5;
  int local_4c;
  int index;
  uintptr_t hooks_end;
  SpinLockHolder l;
  _func_void_void_ptr_unsigned_long *value_local;
  HookList<void_(*)(const_void_*,_unsigned_long)> *this_local;
  memory_order __b;
  
  if (value == (_func_void_void_ptr_unsigned_long *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    l.lock_ = (SpinLock *)value;
    SpinLockHolder::SpinLockHolder((SpinLockHolder *)&hooks_end,(SpinLock *)&hooklist_spinlock);
    std::operator&(memory_order_relaxed,__memory_order_mask);
    uVar1 = (this->priv_end).super___atomic_base<unsigned_long>._M_i;
    local_4c = 0;
    while( true ) {
      SVar2.lock_ = l.lock_;
      bVar5 = false;
      if ((ulong)(long)local_4c < uVar1) {
        paVar3 = cast_priv_data(this,local_4c);
        pSVar4 = (SpinLock *)
                 std::atomic<void_(*)(const_void_*,_unsigned_long)>::load
                           (paVar3,memory_order_relaxed);
        bVar5 = SVar2.lock_ != pSVar4;
      }
      if (!bVar5) break;
      local_4c = local_4c + 1;
    }
    this_local._7_1_ = (long)local_4c != uVar1;
    if (this_local._7_1_) {
      paVar3 = cast_priv_data(this,local_4c);
      std::atomic<void_(*)(const_void_*,_unsigned_long)>::store
                (paVar3,(__pointer_type)0x0,memory_order_relaxed);
      FixupPrivEndLocked(this);
    }
    SpinLockHolder::~SpinLockHolder((SpinLockHolder *)&hooks_end);
  }
  return this_local._7_1_;
}

Assistant:

bool HookList<T>::Remove(T value) {
  if (value == T{}) {
    return false;
  }
  SpinLockHolder l(&hooklist_spinlock);
  uintptr_t hooks_end = priv_end.load(std::memory_order_relaxed);
  int index = 0;
  while (index < hooks_end
         && value != cast_priv_data(index)->load(std::memory_order_relaxed)) {
    ++index;
  }
  if (index == hooks_end) {
    return false;
  }
  cast_priv_data(index)->store(T{}, std::memory_order_relaxed);
  FixupPrivEndLocked();
  return true;
}